

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::util_deleteRows(HModel *this,int firstrow,int lastrow)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int el;
  long lVar11;
  int iVar12;
  
  printf("Called model.util_deleteRows(firstrow=%d, lastrow=%d)\n");
  std::ostream::flush();
  iVar8 = (lastrow - firstrow) + 1;
  pdVar4 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar10 = (long)firstrow; lVar10 < lastrow; lVar10 = lVar10 + 1) {
    pdVar4[lVar10] = pdVar4[iVar8 + lVar10];
    pdVar5[lVar10] = pdVar5[iVar8 + lVar10];
  }
  piVar6 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = 0;
  iVar9 = 0;
  while (lVar10 < this->numCol) {
    iVar3 = piVar6[lVar10];
    piVar6[lVar10] = iVar9;
    lVar10 = lVar10 + 1;
    piVar7 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar11 = (long)iVar3; lVar11 < piVar6[lVar10]; lVar11 = lVar11 + 1) {
      iVar3 = piVar7[lVar11];
      if (iVar3 < firstrow || lastrow < iVar3) {
        iVar12 = iVar8;
        if (iVar3 < firstrow) {
          iVar12 = 0;
        }
        piVar7[iVar9] = iVar3 - iVar12;
        pdVar4[iVar9] = pdVar4[lVar11];
        iVar9 = iVar9 + 1;
      }
    }
  }
  piVar6[this->numCol] = iVar9;
  uVar1 = this->numRow;
  uVar2 = this->numTot;
  this->numRow = uVar1 - iVar8;
  this->numTot = uVar2 - iVar8;
  mlFg_Update(this,this->mlFg_action_DelRows);
  return;
}

Assistant:

void HModel::util_deleteRows(int firstrow, int lastrow) {
  assert(firstrow >= 0);
  assert(lastrow < numRow);
  assert(firstrow <= lastrow);
#ifdef JAJH_dev
  printf("Called model.util_deleteRows(firstrow=%d, lastrow=%d)\n", firstrow, lastrow);cout << flush;
#endif
  int rowStep = lastrow-firstrow+1;
  for (int row = firstrow; row < lastrow; row++) {
    rowLower[row] = rowLower[rowStep+row];
    rowUpper[row] = rowUpper[rowStep+row];
    //    rowScale[row] = rowScale[rowStep+row];
  }

  int nnz = 0;
  for (int col = 0; col < numCol; col++) {
    int fmEl = Astart[col];
    Astart[col] = nnz;
    for (int el = fmEl; el < Astart[col+1]; el++) {
      int row = Aindex[el];
      if (row < firstrow || row > lastrow) {
	if (row < firstrow) {
	  Aindex[nnz] = row;
	} else {
	  Aindex[nnz] = row-rowStep;
	}
	Avalue[nnz] = Avalue[el];
	nnz++;
      }
    }
  }
  Astart[numCol] = nnz;

  //Reduce the number of rows and total number of variables in the model
  numRow -= rowStep;
  numTot -= rowStep;

  //Determine consequences for basis when deleting rows
  mlFg_Update(mlFg_action_DelRows);
 
}